

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,presolve::HPresolve::strengthenInequalities(presolve::HighsPostsolveStack&,int&)::__0>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_4c1942eb comp)

{
  HighsInt i1;
  HighsInt *pHVar1;
  bool bVar2;
  HighsInt *pHVar3;
  HighsInt *pHVar4;
  HighsInt i2;
  long lVar5;
  bool bVar6;
  anon_class_8_1_4c1942eb local_50;
  HighsInt *local_48;
  ulong local_40;
  HighsInt *local_38;
  
  if (begin._M_current == end._M_current) {
LAB_003146ff:
    bVar6 = true;
  }
  else {
    local_40 = 0;
    local_50.reducedcost = comp.reducedcost;
    local_38 = begin._M_current;
    do {
      lVar5 = -(long)begin._M_current;
      pHVar3 = begin._M_current;
      do {
        begin._M_current = pHVar3 + 1;
        bVar6 = begin._M_current == end._M_current;
        if (bVar6) goto LAB_003146ff;
        i2 = *pHVar3;
        i1 = *begin._M_current;
        bVar2 = presolve::HPresolve::strengthenInequalities::anon_class_8_1_4c1942eb::operator()
                          (&local_50,i1,i2);
        lVar5 = lVar5 + -4;
        pHVar3 = begin._M_current;
        pHVar1 = end._M_current;
      } while (!bVar2);
      do {
        local_48 = pHVar1;
        pHVar1 = pHVar3 + -1;
        *pHVar3 = i2;
        pHVar4 = local_38;
        if (pHVar1 == local_38) break;
        i2 = pHVar3[-2];
        bVar2 = presolve::HPresolve::strengthenInequalities::anon_class_8_1_4c1942eb::operator()
                          (&local_50,i1,i2);
        pHVar3 = pHVar1;
        pHVar4 = pHVar1;
        pHVar1 = local_48;
      } while (bVar2);
      *pHVar4 = i1;
      local_40 = local_40 + (-(lVar5 + (long)pHVar4) >> 2);
      end._M_current = local_48;
    } while (local_40 < 9);
  }
  return bVar6;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }